

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_client.c
# Opt level: O0

int main(void)

{
  long lVar1;
  size_t len;
  size_t sVar2;
  undefined1 local_1130 [8];
  mbedtls_aes_context aes;
  mbedtls_dhm_context dhm;
  mbedtls_rsa_context rsa;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  char *pers;
  uchar hash [32];
  uchar buf [2048];
  uchar *end;
  uchar *p;
  ulong uStack_30;
  mbedtls_net_context server_fd;
  size_t buflen;
  size_t n;
  FILE *pFStack_18;
  int ret;
  FILE *f;
  
  f._4_4_ = 0;
  mbedtls_net_init((mbedtls_net_context *)((long)&p + 4));
  mbedtls_rsa_init((mbedtls_rsa_context *)&dhm.pX.p,0,6);
  mbedtls_dhm_init((mbedtls_dhm_context *)(aes.buf + 0x42));
  mbedtls_aes_init((mbedtls_aes_context *)local_1130);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)&rsa.padding);
  printf("\n  . Seeding the random number generator");
  fflush(_stdout);
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  len = strlen("dh_client");
  n._4_4_ = mbedtls_ctr_drbg_seed
                      ((mbedtls_ctr_drbg_context *)&rsa.padding,mbedtls_entropy_func,
                       &ctr_drbg.p_entropy,(uchar *)"dh_client",len);
  if (n._4_4_ == 0) {
    printf("\n  . Reading public key from rsa_pub.txt");
    fflush(_stdout);
    pFStack_18 = fopen("rsa_pub.txt","rb");
    if (pFStack_18 == (FILE *)0x0) {
      n._4_4_ = 1;
      printf(" failed\n  ! Could not open rsa_pub.txt\n  ! Please run rsa_genkey first\n\n");
    }
    else {
      mbedtls_rsa_init((mbedtls_rsa_context *)&dhm.pX.p,0,0);
      n._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.len,0x10,(FILE *)pFStack_18);
      if (n._4_4_ == 0) {
        n._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.N.p,0x10,(FILE *)pFStack_18);
        if (n._4_4_ == 0) {
          sVar2 = mbedtls_mpi_bitlen((mbedtls_mpi *)&rsa.len);
          rsa._0_8_ = sVar2 + 7 >> 3;
          fclose(pFStack_18);
          printf("\n  . Connecting to tcp/%s/%s","localhost","11999");
          fflush(_stdout);
          n._4_4_ = mbedtls_net_connect((mbedtls_net_context *)((long)&p + 4),"localhost","11999",0)
          ;
          if (n._4_4_ == 0) {
            printf("\n  . Receiving the server\'s DH parameters");
            fflush(_stdout);
            memset(hash + 0x18,0,0x800);
            n._4_4_ = mbedtls_net_recv((void *)((long)&p + 4),hash + 0x18,2);
            if (n._4_4_ == 2) {
              uStack_30 = (ulong)(int)(uint)CONCAT11(hash[0x18],hash[0x19]);
              buflen = uStack_30;
              if ((uStack_30 == 0) || (0x800 < uStack_30)) {
                printf(" failed\n  ! Got an invalid buffer length\n\n");
              }
              else {
                memset(hash + 0x18,0,0x800);
                n._4_4_ = mbedtls_net_recv((void *)((long)&p + 4),hash + 0x18,buflen);
                if (n._4_4_ == (uint)buflen) {
                  end = hash + 0x18;
                  lVar1 = uStack_30 + 0x18;
                  n._4_4_ = mbedtls_dhm_read_params
                                      ((mbedtls_dhm_context *)(aes.buf + 0x42),&end,hash + lVar1);
                  if (n._4_4_ == 0) {
                    if (((ulong)aes.buf._264_8_ < 0x40) || (0x200 < (ulong)aes.buf._264_8_)) {
                      n._4_4_ = 1;
                      printf(" failed\n  ! Invalid DHM modulus size\n\n");
                    }
                    else {
                      printf("\n  . Verifying the server\'s RSA signature");
                      fflush(_stdout);
                      end = end + 2;
                      buflen = (long)(hash + lVar1) - (long)end;
                      if (buflen == rsa._0_8_) {
                        mbedtls_sha1(hash + 0x18,(long)(((int)end + -2) - ((int)hash + 0x18)),
                                     (uchar *)&pers);
                        n._4_4_ = mbedtls_rsa_pkcs1_verify
                                            ((mbedtls_rsa_context *)&dhm.pX.p,
                                             (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0,
                                             0,MBEDTLS_MD_SHA256,0,(uchar *)&pers,end);
                        if (n._4_4_ == 0) {
                          printf("\n  . Sending own public value to server");
                          fflush(_stdout);
                          buflen._0_4_ = aes.buf[0x42];
                          buflen._4_4_ = aes.buf[0x43];
                          n._4_4_ = mbedtls_dhm_make_public
                                              ((mbedtls_dhm_context *)(aes.buf + 0x42),aes.buf[0x42]
                                               ,hash + 0x18,aes.buf._264_8_,mbedtls_ctr_drbg_random,
                                               &rsa.padding);
                          if (n._4_4_ == 0) {
                            n._4_4_ = mbedtls_net_send((void *)((long)&p + 4),hash + 0x18,buflen);
                            if (n._4_4_ == (uint)buflen) {
                              printf("\n  . Shared secret: ");
                              fflush(_stdout);
                              n._4_4_ = mbedtls_dhm_calc_secret
                                                  ((mbedtls_dhm_context *)(aes.buf + 0x42),
                                                   hash + 0x18,0x800,&buflen,mbedtls_ctr_drbg_random
                                                   ,&rsa.padding);
                              if (n._4_4_ == 0) {
                                n._4_4_ = 0;
                                for (buflen = 0; buflen < 0x10; buflen = buflen + 1) {
                                  printf("%02x",(ulong)hash[buflen + 0x18]);
                                }
                                printf("...\n  . Receiving and decrypting the ciphertext");
                                fflush(_stdout);
                                mbedtls_aes_setkey_dec
                                          ((mbedtls_aes_context *)local_1130,hash + 0x18,0x100);
                                memset(hash + 0x18,0,0x800);
                                n._4_4_ = mbedtls_net_recv((void *)((long)&p + 4),hash + 0x18,0x10);
                                if (n._4_4_ == 0x10) {
                                  mbedtls_aes_crypt_ecb
                                            ((mbedtls_aes_context *)local_1130,0,hash + 0x18,
                                             hash + 0x18);
                                  printf("\n  . Plaintext is \"%s\"\n\n",hash + 0x18);
                                }
                                else {
                                  printf(" failed\n  ! mbedtls_net_recv returned %d\n\n",
                                         (ulong)n._4_4_);
                                }
                              }
                              else {
                                printf(" failed\n  ! mbedtls_dhm_calc_secret returned %d\n\n",
                                       (ulong)n._4_4_);
                              }
                            }
                            else {
                              printf(" failed\n  ! mbedtls_net_send returned %d\n\n",(ulong)n._4_4_)
                              ;
                            }
                          }
                          else {
                            printf(" failed\n  ! mbedtls_dhm_make_public returned %d\n\n",
                                   (ulong)n._4_4_);
                          }
                        }
                        else {
                          printf(" failed\n  ! mbedtls_rsa_pkcs1_verify returned %d\n\n",
                                 (ulong)n._4_4_);
                        }
                      }
                      else {
                        n._4_4_ = 1;
                        printf(" failed\n  ! Invalid RSA signature size\n\n");
                      }
                    }
                  }
                  else {
                    printf(" failed\n  ! mbedtls_dhm_read_params returned %d\n\n",(ulong)n._4_4_);
                  }
                }
                else {
                  printf(" failed\n  ! mbedtls_net_recv returned %d\n\n",(ulong)n._4_4_);
                }
              }
            }
            else {
              printf(" failed\n  ! mbedtls_net_recv returned %d\n\n",(ulong)n._4_4_);
            }
          }
          else {
            printf(" failed\n  ! mbedtls_net_connect returned %d\n\n",(ulong)n._4_4_);
          }
          goto LAB_00107a46;
        }
      }
      printf(" failed\n  ! mbedtls_mpi_read_file returned %d\n\n",(ulong)n._4_4_);
      fclose(pFStack_18);
    }
  }
  else {
    printf(" failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",(ulong)n._4_4_);
  }
LAB_00107a46:
  mbedtls_net_free((mbedtls_net_context *)((long)&p + 4));
  mbedtls_aes_free((mbedtls_aes_context *)local_1130);
  mbedtls_rsa_free((mbedtls_rsa_context *)&dhm.pX.p);
  mbedtls_dhm_free((mbedtls_dhm_context *)(aes.buf + 0x42));
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)&rsa.padding);
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  return n._4_4_;
}

Assistant:

int main( void )
{
    FILE *f;

    int ret;
    size_t n, buflen;
    mbedtls_net_context server_fd;

    unsigned char *p, *end;
    unsigned char buf[2048];
    unsigned char hash[32];
    const char *pers = "dh_client";

    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_rsa_context rsa;
    mbedtls_dhm_context dhm;
    mbedtls_aes_context aes;

    mbedtls_net_init( &server_fd );
    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, MBEDTLS_MD_SHA256 );
    mbedtls_dhm_init( &dhm );
    mbedtls_aes_init( &aes );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    /*
     * 1. Setup the RNG
     */
    mbedtls_printf( "\n  . Seeding the random number generator" );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    /*
     * 2. Read the server's public RSA key
     */
    mbedtls_printf( "\n  . Reading public key from rsa_pub.txt" );
    fflush( stdout );

    if( ( f = fopen( "rsa_pub.txt", "rb" ) ) == NULL )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not open rsa_pub.txt\n" \
                "  ! Please run rsa_genkey first\n\n" );
        goto exit;
    }

    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );

    if( ( ret = mbedtls_mpi_read_file( &rsa.N, 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.E, 16, f ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_file returned %d\n\n", ret );
        fclose( f );
        goto exit;
    }

    rsa.len = ( mbedtls_mpi_bitlen( &rsa.N ) + 7 ) >> 3;

    fclose( f );

    /*
     * 3. Initiate the connection
     */
    mbedtls_printf( "\n  . Connecting to tcp/%s/%s", SERVER_NAME,
                                             SERVER_PORT );
    fflush( stdout );

    if( ( ret = mbedtls_net_connect( &server_fd, SERVER_NAME,
                                         SERVER_PORT, MBEDTLS_NET_PROTO_TCP ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_connect returned %d\n\n", ret );
        goto exit;
    }

    /*
     * 4a. First get the buffer length
     */
    mbedtls_printf( "\n  . Receiving the server's DH parameters" );
    fflush( stdout );

    memset( buf, 0, sizeof( buf ) );

    if( ( ret = mbedtls_net_recv( &server_fd, buf, 2 ) ) != 2 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_recv returned %d\n\n", ret );
        goto exit;
    }

    n = buflen = ( buf[0] << 8 ) | buf[1];
    if( buflen < 1 || buflen > sizeof( buf ) )
    {
        mbedtls_printf( " failed\n  ! Got an invalid buffer length\n\n" );
        goto exit;
    }

    /*
     * 4b. Get the DHM parameters: P, G and Ys = G^Xs mod P
     */
    memset( buf, 0, sizeof( buf ) );

    if( ( ret = mbedtls_net_recv( &server_fd, buf, n ) ) != (int) n )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_recv returned %d\n\n", ret );
        goto exit;
    }

    p = buf, end = buf + buflen;

    if( ( ret = mbedtls_dhm_read_params( &dhm, &p, end ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_dhm_read_params returned %d\n\n", ret );
        goto exit;
    }

    if( dhm.len < 64 || dhm.len > 512 )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Invalid DHM modulus size\n\n" );
        goto exit;
    }

    /*
     * 5. Check that the server's RSA signature matches
     *    the SHA-256 hash of (P,G,Ys)
     */
    mbedtls_printf( "\n  . Verifying the server's RSA signature" );
    fflush( stdout );

    p += 2;

    if( ( n = (size_t) ( end - p ) ) != rsa.len )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Invalid RSA signature size\n\n" );
        goto exit;
    }

    mbedtls_sha1( buf, (int)( p - 2 - buf ), hash );

    if( ( ret = mbedtls_rsa_pkcs1_verify( &rsa, NULL, NULL, MBEDTLS_RSA_PUBLIC,
                                  MBEDTLS_MD_SHA256, 0, hash, p ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_pkcs1_verify returned %d\n\n", ret );
        goto exit;
    }

    /*
     * 6. Send our public value: Yc = G ^ Xc mod P
     */
    mbedtls_printf( "\n  . Sending own public value to server" );
    fflush( stdout );

    n = dhm.len;
    if( ( ret = mbedtls_dhm_make_public( &dhm, (int) dhm.len, buf, n,
                                 mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_dhm_make_public returned %d\n\n", ret );
        goto exit;
    }

    if( ( ret = mbedtls_net_send( &server_fd, buf, n ) ) != (int) n )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_send returned %d\n\n", ret );
        goto exit;
    }

    /*
     * 7. Derive the shared secret: K = Ys ^ Xc mod P
     */
    mbedtls_printf( "\n  . Shared secret: " );
    fflush( stdout );

    if( ( ret = mbedtls_dhm_calc_secret( &dhm, buf, sizeof( buf ), &n,
                                 mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_dhm_calc_secret returned %d\n\n", ret );
        goto exit;
    }

    for( n = 0; n < 16; n++ )
        mbedtls_printf( "%02x", buf[n] );

    /*
     * 8. Setup the AES-256 decryption key
     *
     * This is an overly simplified example; best practice is
     * to hash the shared secret with a random value to derive
     * the keying material for the encryption/decryption keys,
     * IVs and MACs.
     */
    mbedtls_printf( "...\n  . Receiving and decrypting the ciphertext" );
    fflush( stdout );

    mbedtls_aes_setkey_dec( &aes, buf, 256 );

    memset( buf, 0, sizeof( buf ) );

    if( ( ret = mbedtls_net_recv( &server_fd, buf, 16 ) ) != 16 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_net_recv returned %d\n\n", ret );
        goto exit;
    }

    mbedtls_aes_crypt_ecb( &aes, MBEDTLS_AES_DECRYPT, buf, buf );
    buf[16] = '\0';
    mbedtls_printf( "\n  . Plaintext is \"%s\"\n\n", (char *) buf );

exit:

    mbedtls_net_free( &server_fd );

    mbedtls_aes_free( &aes );
    mbedtls_rsa_free( &rsa );
    mbedtls_dhm_free( &dhm );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}